

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O2

int __thiscall
booster::aio::acceptor::accept(acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  native_type __fd_00;
  int iVar1;
  int extraout_EAX;
  int *piVar2;
  undefined4 in_register_00000034;
  error_code eVar3;
  
  do {
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    iVar1 = ::accept(__fd_00,(sockaddr *)0x0,(socklen_t *)0x0);
    if (-1 < iVar1) goto LAB_00178526;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (iVar1 == -1) {
    eVar3 = socket_details::geterror();
    iVar1 = eVar3._M_value;
    __addr->sa_family = (short)iVar1;
    __addr->sa_data[0] = (char)((uint)iVar1 >> 0x10);
    __addr->sa_data[1] = (char)((uint)iVar1 >> 0x18);
    *(error_category **)(__addr->sa_data + 6) = eVar3._M_cat;
    return iVar1;
  }
LAB_00178526:
  basic_io_device::assign((basic_io_device *)CONCAT44(in_register_00000034,__fd),iVar1);
  return extraout_EAX;
}

Assistant:

void acceptor::accept(stream_socket &target,system::error_code &e)
{
	native_type new_fd = invalid_socket;
	#ifndef BOOSTER_WIN32
	for(;;) {
		new_fd = ::accept(native(),0,0);
		if(new_fd < 0 && errno==EINTR)
			continue;
		break;
	}
	#else
	new_fd = ::accept(native(),0,0);
	#endif

	if(new_fd == invalid_socket) {
		e=geterror();
		return;
	}

	target.assign(new_fd);
	return;
}